

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

_internalformats *
gl4cts::TextureViewUtilities::getInternalformatsFromViewClass
          (_internalformats *__return_storage_ptr__,_view_class view_class)

{
  value_type_conflict4 local_24;
  _view_class current_view_class;
  GLenum internalformat;
  uint n_array_pair;
  uint n_array_elements;
  _internalformats *p_Stack_10;
  _view_class view_class_local;
  _internalformats *result;
  
  n_array_pair._3_1_ = 0;
  n_array_elements = view_class;
  p_Stack_10 = __return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  internalformat = 0x7c;
  for (current_view_class = VIEW_CLASS_128_BITS; current_view_class < 0x3e;
      current_view_class = current_view_class + VIEW_CLASS_96_BITS) {
    local_24 = *(value_type_conflict4 *)
                (internalformat_view_compatibility_array + (ulong)(current_view_class << 1) * 4);
    if (*(uint *)(internalformat_view_compatibility_array + (ulong)(current_view_class * 2 + 1) * 4)
        == n_array_elements) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&local_24);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TextureViewUtilities::_internalformats TextureViewUtilities::getInternalformatsFromViewClass(_view_class view_class)
{
	_internalformats result;

	/* Iterate over the data array and push those internalformats that match the requested view class */
	const unsigned int n_array_elements = n_internalformat_view_compatibility_array_entries;

	for (unsigned int n_array_pair = 0; n_array_pair < (n_array_elements >> 1); ++n_array_pair)
	{
		const glw::GLenum internalformat = internalformat_view_compatibility_array[n_array_pair * 2 + 0];
		const _view_class current_view_class =
			(_view_class)internalformat_view_compatibility_array[n_array_pair * 2 + 1];

		if (current_view_class == view_class)
		{
			result.push_back(internalformat);
		}
	} /* for (all pairs in the data array) */

	return result;
}